

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

void __thiscall cmPauseContext::Step(cmPauseContext *this)

{
  bool bVar1;
  runtime_error *this_00;
  cmPauseContext *this_local;
  
  bVar1 = operator_cast_to_bool(this);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Attempt to step with invalid context");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (*this->Debugger->_vptr_cmDebugger[3])();
  return;
}

Assistant:

void cmPauseContext::Step()
{
  if (!*this) {
    throw std::runtime_error("Attempt to step with invalid context");
  }
  Debugger->Step();
}